

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

int parse_value(frozen *f)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  json_type t;
  json_type len;
  char *s;
  byte *ptr;
  byte *pbVar4;
  
  iVar2 = cur(f);
  if (9 < iVar2 - 0x30U) {
    if (iVar2 == 0x7b) {
      iVar2 = parse_object(f);
LAB_00111352:
      if (-1 < iVar2) {
        return 0;
      }
      return iVar2;
    }
    if (iVar2 != 0x2d) {
      if (iVar2 != 0x5b) {
        if (iVar2 == 0x66) {
          s = "false";
          t = JSON_TYPE_FALSE;
          len = t;
        }
        else if (iVar2 == 0x6e) {
          s = "null";
          t = JSON_TYPE_NULL;
          len = JSON_TYPE_TRUE;
        }
        else {
          if (iVar2 != 0x74) {
            if (iVar2 != 0x22) {
              return ~(uint)(iVar2 == -1);
            }
            iVar2 = parse_string(f);
            goto LAB_00111352;
          }
          s = "true";
          t = JSON_TYPE_TRUE;
          len = t;
        }
        iVar2 = expect(f,s,len,t);
        goto LAB_00111352;
      }
      iVar2 = test_and_skip(f,0x5b);
      if (iVar2 < 0) {
        return iVar2;
      }
      iVar2 = capture_ptr(f,f->cur + -1,JSON_TYPE_ARRAY);
      if (iVar2 < 0) {
        return iVar2;
      }
      iVar2 = f->num_tokens;
      while (iVar3 = cur(f), iVar3 != 0x5d) {
        iVar3 = parse_value(f);
        if (iVar3 < 0) {
          return iVar3;
        }
        iVar3 = cur(f);
        if (iVar3 == 0x2c) {
          f->cur = f->cur + 1;
        }
      }
      iVar3 = test_and_skip(f,0x5d);
      if (iVar3 < 0) {
        return iVar3;
      }
      ptr = (byte *)f->cur;
      goto LAB_0011149a;
    }
  }
  iVar2 = cur(f);
  iVar3 = capture_ptr(f,f->cur,JSON_TYPE_NUMBER);
  if (iVar3 < 0) {
    return iVar3;
  }
  ptr = (byte *)f->cur;
  if (iVar2 == 0x2d) {
    ptr = ptr + 1;
    f->cur = (char *)ptr;
  }
  pbVar1 = (byte *)f->end;
  if (pbVar1 <= ptr) {
    return -2;
  }
  if ((int)(char)*ptr - 0x3aU < 0xfffffff6) {
    return -1;
  }
  while (pbVar4 = ptr + 1, ptr < pbVar1) {
    if ((int)(char)*ptr - 0x3aU < 0xfffffff6) {
      if (*ptr == 0x2e) {
        f->cur = (char *)pbVar4;
        if (pbVar1 <= pbVar4) {
          return -2;
        }
        ptr = pbVar4;
        if ((int)(char)*pbVar4 - 0x3aU < 0xfffffff6) {
          return -1;
        }
        while ((ptr < pbVar1 && (0xfffffff5 < (int)(char)*ptr - 0x3aU))) {
          ptr = ptr + 1;
          f->cur = (char *)ptr;
        }
      }
      break;
    }
    f->cur = (char *)pbVar4;
    ptr = pbVar4;
  }
  if ((ptr < pbVar1) && ((*ptr | 0x20) == 0x65)) {
    pbVar4 = ptr + 1;
    f->cur = (char *)pbVar4;
    if (pbVar1 <= pbVar4) {
      return -2;
    }
    if ((*pbVar4 == 0x2d) || (*pbVar4 == 0x2b)) {
      f->cur = (char *)(ptr + 2);
      pbVar4 = ptr + 2;
    }
    ptr = pbVar4;
    if (pbVar1 <= ptr) {
      return -2;
    }
    if ((int)(char)*ptr - 0x3aU < 0xfffffff6) {
      return -1;
    }
    while ((ptr < pbVar1 && (0xfffffff5 < (int)(char)*ptr - 0x3aU))) {
      ptr = ptr + 1;
      f->cur = (char *)ptr;
    }
  }
  iVar2 = f->num_tokens;
LAB_0011149a:
  capture_len(f,iVar2 + -1,(char *)ptr);
  return 0;
}

Assistant:

static int parse_value(struct frozen *f) {
    int ch = cur(f);

    switch (ch) {
        case '"':
            TRY(parse_string(f));
            break;
        case '{':
            TRY(parse_object(f));
            break;
        case '[':
            TRY(parse_array(f));
            break;
        case 'n':
            TRY(expect(f, "null", 4, JSON_TYPE_NULL));
            break;
        case 't':
            TRY(expect(f, "true", 4, JSON_TYPE_TRUE));
            break;
        case 'f':
            TRY(expect(f, "false", 5, JSON_TYPE_FALSE));
            break;
        case '-':
        case '0':
        case '1':
        case '2':
        case '3':
        case '4':
        case '5':
        case '6':
        case '7':
        case '8':
        case '9':
            TRY(parse_number(f));
            break;
        default:
            return ch == END_OF_STRING ? JSON_STRING_INCOMPLETE : JSON_STRING_INVALID;
    }

    return 0;
}